

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O0

ColumnCountResult * __thiscall duckdb::ColumnCountScanner::ParseChunk(ColumnCountScanner *this)

{
  bool bVar1;
  CSVBufferHandle *pCVar2;
  BaseScanner *in_RDI;
  ColumnCountResult *in_stack_ffffffffffffffe8;
  
  in_RDI[1].iterator.done = false;
  in_RDI[1].iterator.first_one = false;
  *(undefined6 *)&in_RDI[1].iterator.field_0x12 = 0;
  in_RDI[2].error_handler.internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1;
  bVar1 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::CSVBufferHandle,_true> *)0x1adaf05);
  if (bVar1) {
    pCVar2 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                       ((shared_ptr<duckdb::CSVBufferHandle,_true> *)in_RDI);
    in_RDI[1].iterator.boundary.buffer_pos = pCVar2->actual_size;
  }
  BaseScanner::ParseChunkInternal<duckdb::ColumnCountResult>(in_RDI,in_stack_ffffffffffffffe8);
  return (ColumnCountResult *)(in_RDI + 1);
}

Assistant:

ColumnCountResult &ColumnCountScanner::ParseChunk() {
	result.result_position = 0;
	column_count = 1;
	if (cur_buffer_handle) {
		result.current_buffer_size = cur_buffer_handle->actual_size;
	}
	ParseChunkInternal(result);
	return result;
}